

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

void __thiscall
phmap::container_internal::
raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,unsigned_long>,phmap::Hash<unsigned_int>,phmap::EqualTo<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_long>>>
::
emplace_at<std::piecewise_construct_t_const&,std::tuple<unsigned_int&&>,std::tuple<unsigned_long&&>>
          (raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,unsigned_long>,phmap::Hash<unsigned_int>,phmap::EqualTo<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_long>>>
           *this,size_t i,piecewise_construct_t *args,tuple<unsigned_int_&&> *args_1,
          tuple<unsigned_long_&&> *args_2)

{
  uint uVar1;
  long lVar2;
  unsigned_long *puVar3;
  undefined1 auVar4 [16];
  long lVar5;
  iterator iVar6;
  
  lVar2 = *(long *)(this + 8);
  lVar5 = i * 0x10;
  puVar3 = (args_2->super__Tuple_impl<0UL,_unsigned_long_&&>).
           super__Head_base<0UL,_unsigned_long_&&,_false>._M_head_impl;
  uVar1 = *(args_1->super__Tuple_impl<0UL,_unsigned_int_&&>).
           super__Head_base<0UL,_unsigned_int_&&,_false>._M_head_impl;
  *(uint *)(lVar2 + lVar5) = uVar1;
  *(unsigned_long *)(lVar2 + 8 + lVar5) = *puVar3;
  auVar4 = ZEXT416(uVar1) * ZEXT816(0xde5fb9d2630458e9);
  iVar6 = raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
          ::find<unsigned_int>
                    ((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                      *)this,(key_arg<unsigned_int> *)(lVar2 + lVar5),auVar4._8_8_ + auVar4._0_8_);
  if (iVar6.ctrl_ == (ctrl_t *)(i + *(long *)this)) {
    return;
  }
  __assert_fail("PolicyTraits::apply(FindElement{*this}, *iterator_at(i)) == iterator_at(i) && \"constructed value does not match the lookup key\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/siemens[P]drace/vendor/greg7mdp/parallel-hashmap/parallel_hashmap/phmap.h"
                ,0x802,
                "void phmap::container_internal::raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned int, unsigned long>, phmap::Hash<uint32_t>, phmap::EqualTo<unsigned int>, std::allocator<std::pair<const unsigned int, unsigned long>>>::emplace_at(size_t, Args &&...) [Policy = phmap::container_internal::FlatHashMapPolicy<unsigned int, unsigned long>, Hash = phmap::Hash<uint32_t>, Eq = phmap::EqualTo<unsigned int>, Alloc = std::allocator<std::pair<const unsigned int, unsigned long>>, Args = <const std::piecewise_construct_t &, std::tuple<unsigned int &&>, std::tuple<unsigned long &&>>]"
               );
}

Assistant:

void emplace_at(size_t i, Args&&... args) {
        PolicyTraits::construct(&alloc_ref(), slots_ + i,
                                std::forward<Args>(args)...);

        assert(PolicyTraits::apply(FindElement{*this}, *iterator_at(i)) ==
               iterator_at(i) &&
               "constructed value does not match the lookup key");
    }